

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O2

float __thiscall nv::SincFilter::evaluate(SincFilter *this,float x)

{
  float fVar1;
  
  fVar1 = anon_unknown.dwarf_4c8503::sincf(x * 3.1415927);
  return fVar1;
}

Assistant:

float SincFilter::evaluate(float x) const
{
	return sincf(PI * x);
}